

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O3

void __thiscall Minisat::OnlineProofChecker::fullCheck(OnlineProofChecker *this)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  ostream *poVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  long *plVar18;
  uint uVar19;
  
  if (0 < *(int *)(this + 0x28)) {
    lVar12 = 0;
    do {
      uVar5 = *(uint *)(*(long *)(this + 0x20) + lVar12 * 4);
      uVar13 = *(ulong *)(*(long *)(this + 8) + (ulong)uVar5 * 4);
      if ((uVar13 & 3) == 0) {
        puVar1 = (ulong *)(*(long *)(this + 8) + (ulong)uVar5 * 4);
        if ((uVar13 & 0xfffffffc00000000) == 0x400000000) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"there should not be unit clauses! [",0x23);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
          if (0x3ffffffff < *puVar1) {
            uVar13 = 0;
            do {
              uVar5 = *(uint *)((long)puVar1 + uVar13 * 4 + 8);
              uVar15 = (int)uVar5 >> 1;
              uVar2 = ~uVar15;
              if ((uVar5 & 1) == 0) {
                uVar2 = uVar15 + 1;
              }
              std::ostream::operator<<((ostream *)poVar7,uVar2);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              uVar13 = uVar13 + 1;
            } while (uVar13 < *puVar1 >> 0x22);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
        }
        else {
          lVar8 = 0;
          bVar4 = true;
          do {
            bVar14 = bVar4;
            iVar6 = *(int *)((long)puVar1 + lVar8 * 4 + 8);
            lVar10 = ((long)iVar6 ^ 1U) * 0x10;
            lVar8 = (long)*(int *)(*(long *)(this + 0x58) + 8 + lVar10);
            if (0 < lVar8) {
              lVar11 = 0;
              do {
                if (*(uint *)(*(long *)(*(long *)(this + 0x58) + lVar10) + lVar11 * 8) == uVar5)
                goto LAB_0010c37f;
                lVar11 = lVar11 + 1;
              } while (lVar8 != lVar11);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"could not find clause[",0x16);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
            if (0x3ffffffff < *puVar1) {
              uVar13 = 0;
              do {
                uVar2 = *(uint *)((long)puVar1 + uVar13 * 4 + 8);
                uVar16 = (int)uVar2 >> 1;
                uVar15 = ~uVar16;
                if ((uVar2 & 1) == 0) {
                  uVar15 = uVar16 + 1;
                }
                std::ostream::operator<<((ostream *)poVar7,uVar15);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                uVar13 = uVar13 + 1;
              } while (uVar13 < *puVar1 >> 0x22);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," in watcher for lit ",0x14);
            uVar2 = ~(iVar6 >> 1);
            if (((long)iVar6 & 1U) != 0) {
              uVar2 = (iVar6 >> 1) + 1;
            }
            std::ostream::operator<<((ostream *)poVar7,uVar2);
            std::ostream::flush();
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
LAB_0010c37f:
            lVar8 = 1;
            bVar4 = false;
          } while (bVar14);
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < *(int *)(this + 0x28));
  }
  if (0 < *(int *)(this + 0xe0)) {
    uVar5 = 0;
    do {
      uVar2 = uVar5 * 2;
      uVar15 = ~uVar5;
      uVar5 = uVar5 + 1;
      uVar16 = 0;
      bVar4 = true;
      do {
        bVar14 = bVar4;
        uVar19 = uVar16 | uVar2;
        lVar12 = (ulong)uVar19 * 0x10;
        iVar6 = *(int *)(*(long *)(this + 0x58) + 8 + lVar12);
        if (0 < iVar6) {
          plVar18 = (long *)(*(long *)(this + 0x58) + lVar12);
          uVar19 = uVar19 ^ 1;
          uVar9 = uVar5;
          if (uVar16 != 0) {
            uVar9 = uVar15;
          }
          lVar12 = 0;
          do {
            uVar13 = (ulong)*(uint *)(*plVar18 + lVar12 * 8);
            if ((*(uint *)(*(long *)(this + 8) + 8 + uVar13 * 4) != uVar19) &&
               (puVar1 = (ulong *)(*(long *)(this + 8) + uVar13 * 4),
               *(uint *)((long)puVar1 + 0xc) != uVar19)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"wrong literals for clause [",0x1b);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
              if (0x3ffffffff < *puVar1) {
                uVar13 = 0;
                do {
                  uVar16 = *(uint *)((long)puVar1 + uVar13 * 4 + 8);
                  uVar17 = (int)uVar16 >> 1;
                  uVar3 = ~uVar17;
                  if ((uVar16 & 1) == 0) {
                    uVar3 = uVar17 + 1;
                  }
                  std::ostream::operator<<((ostream *)poVar7,uVar3);
                  std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                  uVar13 = uVar13 + 1;
                } while (uVar13 < *puVar1 >> 0x22);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7," are watched. Found in list for ",0x20);
              std::ostream::operator<<((ostream *)poVar7,uVar9);
              std::ostream::flush();
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              iVar6 = (int)plVar18[1];
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < iVar6);
        }
        uVar16 = 1;
        bVar4 = false;
      } while (bVar14);
    } while ((int)uVar5 < *(int *)(this + 0xe0));
  }
  return;
}

Assistant:

inline void OnlineProofChecker::fullCheck()
{
    for (int i = 0; i < clauses.size(); ++i) {
        const CRef cr = clauses[i];
        const Clause &c = ca[cr];
        if (c.mark()) {
            continue;
        }

        if (c.size() == 1) {
            std::cerr << "there should not be unit clauses! [" << cr << "]" << c << std::endl;
        } else {
            for (int j = 0; j < 2; ++j) {
                const Lit l = ~c[j];
                vec<Watcher> &ws = watches[l];
                bool didFind = false;
                for (int j = 0; j < ws.size(); ++j) {
                    CRef wcr = ws[j].cref;
                    if (wcr == cr) {
                        didFind = true;
                        break;
                    }
                }
                if (!didFind) {
                    std::cerr << "could not find clause[" << cr << "] " << c << " in watcher for lit " << l << std::endl;
                }
            }
        }
    }

    for (Var v = 0; v < nVars(); ++v) {
        for (int p = 0; p < 2; ++p) {
            const Lit l = mkLit(v, p == 1);
            vec<Watcher> &ws = watches[l];
            for (int j = 0; j < ws.size(); ++j) {
                CRef wcr = ws[j].cref;
                const Clause &c = ca[wcr];
                if (c[0] != ~l && c[1] != ~l) {
                    std::cerr << "wrong literals for clause [" << wcr << "] " << c << " are watched. Found in list for "
                              << l << std::endl;
                }
            }
        }
    }
}